

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

string_t __thiscall
duckdb::TrimOperator<true,true>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<true,true> *this,string_t input,Vector *result)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *__dest;
  ulong uVar5;
  idx_t next;
  ulong uVar6;
  ulong uVar7;
  utf8proc_int32_t codepoint;
  string_t target;
  int local_5c;
  Vector *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  undefined8 local_40;
  long local_38;
  
  local_58 = input.value._8_8_;
  local_38 = input.value._0_8_;
  lVar3 = local_38;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_40 + 4;
  }
  uVar4 = (ulong)this & 0xffffffff;
  uVar6 = 0;
  local_40 = this;
  do {
    uVar5 = uVar6;
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) break;
    lVar2 = duckdb::utf8proc_iterate((uchar *)(lVar3 + uVar5),uVar4 - uVar5,&local_5c);
    iVar1 = duckdb::utf8proc_category(local_5c);
    uVar6 = lVar2 + uVar5;
  } while (iVar1 == 0x17);
  uVar6 = uVar5;
  uVar7 = uVar5;
  while (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
    lVar2 = duckdb::utf8proc_iterate((uchar *)(lVar3 + uVar6),uVar4 - uVar6,&local_5c);
    uVar6 = uVar6 + lVar2;
    iVar1 = duckdb::utf8proc_category(local_5c);
    if (iVar1 != 0x17) {
      uVar7 = uVar6;
    }
  }
  local_50 = (anon_union_16_2_67f50693_for_value)
             duckdb::StringVector::EmptyString(local_58,uVar7 - uVar5);
  __dest = local_50.pointer.prefix;
  if (0xc < local_50.pointer.length) {
    __dest = local_50.pointer.ptr;
  }
  memcpy(__dest,(void *)(lVar3 + uVar5),uVar7 - uVar5);
  string_t::Finalize((string_t *)&local_50.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}